

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_cstring.hpp
# Opt level: O0

self_type * __thiscall
boost::unit_test::basic_cstring<const_char>::trim_right
          (basic_cstring<const_char> *this,self_type *exclusions)

{
  bool bVar1;
  iterator pvVar2;
  const_char *pcVar3;
  self_type *psVar4;
  basic_cstring<const_char> *in_RSI;
  basic_cstring<const_char> *in_RDI;
  iterator it;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  basic_cstring<const_char> *in_stack_ffffffffffffffb0;
  iterator s;
  iterator local_28;
  self_type local_20 [2];
  
  bVar1 = is_empty(in_RSI);
  if (bVar1) {
    default_trim_ex();
    operator=(in_RSI,local_20);
  }
  local_28 = end(in_RDI);
  do {
    local_28 = local_28 + -1;
    s = local_28;
    pvVar2 = begin(in_RDI);
    if (s == pvVar2 + -1) break;
    in_stack_ffffffffffffffb0 = (basic_cstring<const_char> *)begin(in_RSI);
    size(in_RSI);
    pcVar3 = ut_detail::bcs_char_traits_impl<const_char>::find
                       (s,(size_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  } while (pcVar3 != (const_char *)0x0);
  psVar4 = trim_right(in_stack_ffffffffffffffb0,
                      (iterator)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  return psVar4;
}

Assistant:

inline basic_cstring<CharT>&
basic_cstring<CharT>::trim_right( basic_cstring exclusions )
{
    if( exclusions.is_empty() )
        exclusions = default_trim_ex();

    iterator it;

    for( it = end()-1; it != begin()-1; --it ) {
        if( self_type::traits_type::find( exclusions.begin(),  exclusions.size(), *it ) == reinterpret_cast<pointer>(0) )
            break;
    }

    return trim_right( it+1 );
}